

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O3

bool __thiscall ASDCP::MXF::TLVReader::FindTL(TLVReader *this,MDDEntry *Entry)

{
  ui32_t uVar1;
  IPrimerLookup *pIVar2;
  int iVar3;
  iterator iVar4;
  ILogSink *this_00;
  TagValue TmpTag;
  TagValue local_b2;
  undefined **local_b0;
  undefined1 local_a8;
  undefined4 local_a7;
  undefined4 uStack_a3;
  undefined4 uStack_9f;
  undefined4 uStack_9b;
  int local_90 [26];
  
  pIVar2 = this->m_Lookup;
  if (pIVar2 == (IPrimerLookup *)0x0) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(this_00,"No Lookup service\n");
    return false;
  }
  local_a8 = 1;
  local_a7 = *(undefined4 *)Entry->ul;
  uStack_a3 = *(undefined4 *)(Entry->ul + 4);
  uStack_9f = *(undefined4 *)(Entry->ul + 8);
  uStack_9b = *(undefined4 *)(Entry->ul + 0xc);
  local_b0 = &PTR__IArchive_0021d318;
  (*pIVar2->_vptr_IPrimerLookup[4])((Result_t *)local_90,pIVar2,&local_b0,&local_b2);
  iVar3 = Kumu::RESULT_OK;
  Kumu::Result_t::~Result_t((Result_t *)local_90);
  if (local_90[0] != iVar3) {
    if ((Entry->tag).a == '\0') {
      return false;
    }
    local_b2 = Entry->tag;
  }
  iVar4 = std::
          _Rb_tree<ASDCP::TagValue,_std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<ASDCP::TagValue>,_std::allocator<std::pair<const_ASDCP::TagValue,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          ::find(&(this->m_ElementMap)._M_t,&local_b2);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->m_ElementMap)._M_t._M_impl.super__Rb_tree_header)
  {
    return false;
  }
  uVar1 = *(ui32_t *)&iVar4._M_node[1].field_0x4;
  (this->super_MemIOReader).m_size = uVar1;
  (this->super_MemIOReader).m_capacity = uVar1 + *(int *)&iVar4._M_node[1]._M_parent;
  return true;
}

Assistant:

bool
ASDCP::MXF::TLVReader::FindTL(const MDDEntry& Entry)
{
  if ( m_Lookup == 0 )
    {
      DefaultLogSink().Error("No Lookup service\n");
      return false;
    }
  
  TagValue TmpTag;

  if ( m_Lookup->TagForKey(Entry.ul, TmpTag) != RESULT_OK )
    {
      if ( Entry.tag.a == 0 )
	{
	  //	  DefaultLogSink().Debug("No such UL in this TL list: %s (%02x %02x)\n",
	  //				 Entry.name, Entry.tag.a, Entry.tag.b);
	  return false;
	}

      TmpTag = Entry.tag;
    }

  TagMap::iterator e_i = m_ElementMap.find(TmpTag);

  if ( e_i != m_ElementMap.end() )
    {
      m_size = (*e_i).second.first;
      m_capacity = m_size + (*e_i).second.second;
      return true;
    }

  //  DefaultLogSink().Debug("Not Found (%02x %02x): %s\n", TmpTag.a, TmpTag.b, Entry.name);
  return false;
}